

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::rpc_session::close_socket(rpc_session *this)

{
  rpc_session *this_local;
  
  return;
}

Assistant:

void close_socket() {
        // MONSTOR-9378: Do nothing (the same as in `asio_rpc_client`),
        // early closing socket before destroying this instance
        // may cause problem, especially when SSL is enabled.
#if 0
        if (socket_.is_open()) {
            std::unique_lock<std::mutex> l(socket_lock_, std::try_to_lock);
            if (l.owns_lock() && socket_.is_open()) {
                socket_.close();
            }
        }
#endif
    }